

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O1

LY_ERR lyds_merge_nodes1(lyd_node **first_dst,lyd_node **leader_dst,lyd_meta *root_meta_dst,
                        rb_node *rbt_dst,lyd_node **first_src,lyd_node *leader_src,lyd_node **next_p
                        )

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  lyd_node *node;
  rb_node *rbn;
  lysc_type_bitenum_item *local_40;
  rb_node *local_38;
  
  local_40 = (lysc_type_bitenum_item *)rbt_dst;
  if (leader_src != (lyd_node *)0x0) {
    plVar1 = leader_src->schema;
    node = leader_src;
    do {
      leader_src = node;
      if ((node->schema != plVar1) ||
         (LVar2 = rb_insert(node,(rb_node **)&local_40,&local_38), LVar2 != LY_SUCCESS)) break;
      leader_src = node->next;
      lyd_unlink_ignore_lyds(first_src,node);
      lyds_link_data_node(first_dst,leader_dst,node,root_meta_dst,local_38);
      lyd_insert_hash(node);
      node = leader_src;
    } while (leader_src != (lyd_node *)0x0);
  }
  *next_p = leader_src;
  (root_meta_dst->value).field_2.enum_item = local_40;
  return (LY_ERR)local_40;
}

Assistant:

static LY_ERR
lyds_merge_nodes1(struct lyd_node **first_dst, struct lyd_node **leader_dst, struct lyd_meta *root_meta_dst,
        struct rb_node *rbt_dst, struct lyd_node **first_src, struct lyd_node *leader_src, struct lyd_node **next_p)
{
    LY_ERR ret;
    struct rb_node *rbn;
    struct lyd_node *iter, *next;
    const struct lysc_node *schema;

    schema = leader_src->schema;
    for (iter = leader_src; iter && (iter->schema == schema); iter = next) {
        ret = rb_insert(iter, &rbt_dst, &rbn);
        if (ret) {
            /* allocation failed, @p next_p must refer to failed node */
            break;
        }
        next = iter->next;
        lyd_unlink_ignore_lyds(first_src, iter);
        lyds_link_data_node(first_dst, leader_dst, iter, root_meta_dst, rbn);
        lyd_insert_hash(iter);
    }
    *next_p = iter;

    RBT_SET(root_meta_dst, rbt_dst);

    return LY_SUCCESS;
}